

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O1

void __thiscall LinePrinter::SetConsoleLocked(LinePrinter *this,bool locked)

{
  size_type sVar1;
  pointer pcVar2;
  string local_60;
  string local_40;
  
  if (this->console_locked_ != locked) {
    if (locked) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
      PrintOnNewLine(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      this->console_locked_ = locked;
      if (locked) {
        return;
      }
    }
    else {
      this->console_locked_ = locked;
    }
    PrintOnNewLine(this,&this->output_buffer_);
    sVar1 = (this->line_buffer_)._M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (this->line_buffer_)._M_dataplus._M_p;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar2,pcVar2 + sVar1);
      Print(this,&local_40,this->line_type_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    (this->output_buffer_)._M_string_length = 0;
    *(this->output_buffer_)._M_dataplus._M_p = '\0';
    (this->line_buffer_)._M_string_length = 0;
    *(this->line_buffer_)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void LinePrinter::SetConsoleLocked(bool locked) {
  if (locked == console_locked_)
    return;

  if (locked)
    PrintOnNewLine("");

  console_locked_ = locked;

  if (!locked) {
    PrintOnNewLine(output_buffer_);
    if (!line_buffer_.empty()) {
      Print(line_buffer_, line_type_);
    }
    output_buffer_.clear();
    line_buffer_.clear();
  }
}